

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerCoverageFuncs(Builtins *this)

{
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  initializer_list<const_slang::ast::Type_*> __l_04;
  initializer_list<const_slang::ast::Type_*> __l_05;
  shared_ptr<slang::ast::SystemSubroutine> *subroutine;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *__args_3;
  long in_RDI;
  shared_ptr<slang::ast::NonConstantFunction> *in_stack_fffffffffffffbf8;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffc00;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_fffffffffffffc10;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *this_00;
  FloatingType *in_stack_fffffffffffffc20;
  allocator_type *in_stack_fffffffffffffc28;
  allocator_type *__a;
  PredefinedIntegerType *in_stack_fffffffffffffc30;
  VoidType *__args_1;
  iterator in_stack_fffffffffffffc38;
  iterator __args;
  PredefinedIntegerType *in_stack_fffffffffffffc40;
  undefined1 *puVar1;
  KnownSystemName *in_stack_fffffffffffffc48;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffc90;
  Builtins *in_stack_fffffffffffffc98;
  Builtins *this_01;
  undefined1 local_339 [49];
  undefined4 local_308;
  undefined4 local_304;
  shared_ptr<slang::ast::SystemSubroutine> local_2f0;
  allocator_type local_2d9;
  long local_2d8;
  long *local_2d0;
  undefined8 local_2c8;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_27c;
  undefined1 local_278 [40];
  Symbol *local_250;
  long local_248;
  SyntaxNode *local_240;
  Type *local_238;
  undefined4 local_218;
  undefined4 local_214;
  undefined1 local_200 [23];
  allocator<const_slang::ast::Type_*> local_1e9;
  long local_1e8;
  long local_1e0;
  long *local_1d8;
  undefined8 local_1d0;
  undefined4 local_1b0;
  undefined4 local_1ac;
  allocator<const_slang::ast::Type_*> local_181;
  long local_180;
  long local_178;
  long local_170;
  long *local_168;
  undefined8 local_160;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined1 local_109;
  shared_ptr<slang::ast::SystemSubroutine> *local_108;
  shared_ptr<slang::ast::SystemSubroutine> *local_100;
  long local_f8;
  shared_ptr<slang::ast::SystemSubroutine> **local_f0;
  undefined8 local_e8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  allocator<const_slang::ast::Type_*> local_81;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long *local_60;
  undefined8 local_58;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  local_2c = 0x14;
  local_80 = in_RDI + 0x210;
  local_30 = 3;
  local_34 = 4;
  local_68 = in_RDI + 0x5c0;
  local_60 = &local_80;
  local_58 = 4;
  local_78 = local_80;
  local_70 = local_80;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xaebdd9);
  __l._M_len = (size_type)in_stack_fffffffffffffc40;
  __l._M_array = in_stack_fffffffffffffc38;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc30,__l,in_stack_fffffffffffffc28);
  std::
  make_shared<slang::ast::builtins::CoverageNameOrHierFunc,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc38,
             (int *)in_stack_fffffffffffffc30,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc28);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc,void>
            (in_stack_fffffffffffffc00,
             (shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc> *)in_stack_fffffffffffffbf8);
  addSystemSubroutine(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaebe78);
  std::shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc> *)0xaebe85);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffffc10);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_81);
  local_bc = 0x15;
  subroutine = (shared_ptr<slang::ast::SystemSubroutine> *)(in_RDI + 0x210);
  local_c0 = 2;
  local_c4 = 3;
  local_f8 = in_RDI + 0x5c0;
  local_f0 = &local_108;
  local_e8 = 3;
  this_01 = (Builtins *)&local_109;
  local_108 = subroutine;
  local_100 = subroutine;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xaebf29);
  __l_00._M_len = (size_type)in_stack_fffffffffffffc40;
  __l_00._M_array = in_stack_fffffffffffffc38;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc30,__l_00,in_stack_fffffffffffffc28);
  std::
  make_shared<slang::ast::builtins::CoverageNameOrHierFunc,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc38,
             (int *)in_stack_fffffffffffffc30,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc28);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc,void>
            (in_stack_fffffffffffffc00,
             (shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc> *)in_stack_fffffffffffffbf8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaebfc8);
  std::shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc> *)0xaebfd5);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffffc10);
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)&local_109);
  local_134 = 0x16;
  local_180 = in_RDI + 0x210;
  local_138 = 2;
  local_13c = 3;
  local_170 = in_RDI + 0x5c0;
  local_168 = &local_180;
  local_160 = 3;
  local_178 = local_180;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xaec079);
  __l_01._M_len = (size_type)in_stack_fffffffffffffc40;
  __l_01._M_array = in_stack_fffffffffffffc38;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc30,__l_01,in_stack_fffffffffffffc28);
  std::
  make_shared<slang::ast::builtins::CoverageNameOrHierFunc,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc38,
             (int *)in_stack_fffffffffffffc30,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc28);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc,void>
            (in_stack_fffffffffffffc00,
             (shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc> *)in_stack_fffffffffffffbf8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec112);
  std::shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::CoverageNameOrHierFunc> *)0xaec11f);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffffc10);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_181);
  local_1ac = 0x17;
  local_1e8 = in_RDI + 0x210;
  local_1b0 = 2;
  local_1e0 = in_RDI + 0x5c0;
  local_1d8 = &local_1e8;
  local_1d0 = 2;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xaec1aa);
  __l_02._M_len = (size_type)in_stack_fffffffffffffc40;
  __l_02._M_array = in_stack_fffffffffffffc38;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc30,__l_02,in_stack_fffffffffffffc28);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             (int *)in_stack_fffffffffffffc28,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc20);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec235);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0xaec242);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffffc10);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_1e9);
  local_214 = 0x18;
  local_250 = (Symbol *)(in_RDI + 0x210);
  local_218 = 2;
  local_248 = in_RDI + 0x5c0;
  local_240 = (SyntaxNode *)&local_250;
  local_238 = (Type *)0x2;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xaec2cd);
  __l_03._M_len = (size_type)in_stack_fffffffffffffc40;
  __l_03._M_array = in_stack_fffffffffffffc38;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc30,__l_03,in_stack_fffffffffffffc28);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             (int *)in_stack_fffffffffffffc28,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_fffffffffffffc20);
  puVar1 = local_200;
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec358);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0xaec365);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffffc10);
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)(local_278 + 0x27));
  local_27c = 0x19;
  __args_1 = (VoidType *)local_278;
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::FloatingType&>
            ((KnownSystemName *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  __args = (iterator)(local_278 + 0x10);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec3eb);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0xaec3f8);
  local_2a4 = 0x1a;
  __args_3 = (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (in_RDI + 0x608);
  local_2a8 = 1;
  local_2d8 = in_RDI + 0x5c0;
  local_2d0 = &local_2d8;
  local_2c8 = 1;
  __a = &local_2d9;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xaec461);
  __l_04._M_len = (size_type)puVar1;
  __l_04._M_array = __args;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)__args_1
             ,__l_04,__a);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)__args,__args_1,(int *)__a,__args_3);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec4ec);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0xaec4f9);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_fffffffffffffc10);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_2d9);
  local_304 = 0x1b;
  local_308 = 1;
  local_339._1_8_ = in_RDI + 0x5c0;
  local_339._9_8_ = local_339 + 1;
  local_339._17_8_ = 1;
  this_00 = (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_339
  ;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xaec57c);
  __l_05._M_len = (size_type)puVar1;
  __l_05._M_array = __args;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)__args_1
             ,__l_05,__a);
  std::
  make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)__args,__args_1,(int *)__a,__args_3);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
            (&local_2f0,in_stack_fffffffffffffbf8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec607);
  std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
            ((shared_ptr<slang::ast::NonConstantFunction> *)0xaec614);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector(this_00)
  ;
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)local_339);
  return;
}

Assistant:

void Builtins::registerCoverageFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(name, ...) addSystemSubroutine(std::make_shared<name>(__VA_ARGS__))
    REGISTER(CoverageNameOrHierFunc, KnownSystemName::CoverageControl, intType, 3, 4,
             std::vector<const Type*>{&intType, &intType, &intType, &stringType});
    REGISTER(CoverageNameOrHierFunc, KnownSystemName::CoverageGetMax, intType, 2, 3,
             std::vector<const Type*>{&intType, &intType, &stringType});
    REGISTER(CoverageNameOrHierFunc, KnownSystemName::CoverageGet, intType, 2, 3,
             std::vector<const Type*>{&intType, &intType, &stringType});

    REGISTER(NonConstantFunction, KnownSystemName::CoverageMerge, intType, 2,
             std::vector<const Type*>{&intType, &stringType});
    REGISTER(NonConstantFunction, KnownSystemName::CoverageSave, intType, 2,
             std::vector<const Type*>{&intType, &stringType});
    REGISTER(NonConstantFunction, KnownSystemName::GetCoverage, realType);
    REGISTER(NonConstantFunction, KnownSystemName::SetCoverageDbName, voidType, 1,
             std::vector<const Type*>{&stringType});
    REGISTER(NonConstantFunction, KnownSystemName::LoadCoverageDb, voidType, 1,
             std::vector<const Type*>{&stringType});
#undef REGISTER
}